

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_Duplicate(cJSON *item,int recurse)

{
  char *pcVar1;
  cJSON *c;
  size_t sVar2;
  char *pcVar3;
  cJSON *pcVar4;
  cJSON *item_00;
  cJSON *pcVar5;
  
  if (item == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  c = (cJSON *)(*cJSON_malloc)(0x40);
  if (c == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  c->valuedouble = 0.0;
  c->string = (char *)0x0;
  c->valuestring = (char *)0x0;
  *(undefined8 *)&c->valueint = 0;
  c->child = (cJSON *)0x0;
  *(undefined8 *)&c->type = 0;
  c->next = (cJSON *)0x0;
  c->prev = (cJSON *)0x0;
  c->type = item->type & 0xfffffeff;
  c->valueint = item->valueint;
  c->valuedouble = item->valuedouble;
  pcVar1 = item->valuestring;
  if (pcVar1 != (char *)0x0) {
    sVar2 = strlen(pcVar1);
    pcVar3 = (char *)(*cJSON_malloc)(sVar2 + 1);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      memcpy(pcVar3,pcVar1,sVar2 + 1);
    }
    c->valuestring = pcVar3;
    if (pcVar3 == (char *)0x0) goto LAB_00107e2d;
  }
  pcVar1 = item->string;
  if (pcVar1 != (char *)0x0) {
    sVar2 = strlen(pcVar1);
    pcVar3 = (char *)(*cJSON_malloc)(sVar2 + 1);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      memcpy(pcVar3,pcVar1,sVar2 + 1);
    }
    c->string = pcVar3;
    if (pcVar3 == (char *)0x0) goto LAB_00107e2d;
  }
  if (recurse == 0) {
    return c;
  }
  item_00 = item->child;
  if (item_00 == (cJSON *)0x0) {
    return c;
  }
  pcVar5 = (cJSON *)0x0;
  while (pcVar4 = cJSON_Duplicate(item_00,1), pcVar4 != (cJSON *)0x0) {
    if (pcVar5 == (cJSON *)0x0) {
      c->child = pcVar4;
    }
    else {
      pcVar5->next = pcVar4;
      pcVar4->prev = pcVar5;
    }
    item_00 = item_00->next;
    pcVar5 = pcVar4;
    if (item_00 == (cJSON *)0x0) {
      return c;
    }
  }
LAB_00107e2d:
  cJSON_Delete(c);
  return (cJSON *)0x0;
}

Assistant:

cJSON *cJSON_Duplicate(cJSON *item,int recurse)
{
	cJSON *newitem,*cptr,*nptr=0,*newchild;
	/* Bail on bad ptr */
	if (!item) return 0;
	/* Create new item */
	newitem=cJSON_New_Item();
	if (!newitem) return 0;
	/* Copy over all vars */
	newitem->type=item->type&(~cJSON_IsReference),newitem->valueint=item->valueint,newitem->valuedouble=item->valuedouble;
	if (item->valuestring)	{newitem->valuestring=cJSON_strdup(item->valuestring);	if (!newitem->valuestring)	{cJSON_Delete(newitem);return 0;}}
	if (item->string)		{newitem->string=cJSON_strdup(item->string);			if (!newitem->string)		{cJSON_Delete(newitem);return 0;}}
	/* If non-recursive, then we're done! */
	if (!recurse) return newitem;
	/* Walk the ->next chain for the child. */
	cptr=item->child;
	while (cptr)
	{
		newchild=cJSON_Duplicate(cptr,1);		/* Duplicate (with recurse) each item in the ->next chain */
		if (!newchild) {cJSON_Delete(newitem);return 0;}
		if (nptr)	{nptr->next=newchild,newchild->prev=nptr;nptr=newchild;}	/* If newitem->child already set, then crosswire ->prev and ->next and move on */
		else		{newitem->child=newchild;nptr=newchild;}					/* Set newitem->child and move to it */
		cptr=cptr->next;
	}
	return newitem;
}